

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O3

int SUNMatScaleAdd_Band(realtype c,SUNMatrix A,SUNMatrix B)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  SUNMatrix A_00;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  iVar8 = SMCompatible_Band(A,B);
  if (iVar8 == 0) {
    iVar8 = -0x2bd;
  }
  else {
    pvVar3 = B->content;
    iVar1 = *(int *)((long)pvVar3 + 0xc);
    pvVar4 = A->content;
    iVar8 = *(int *)((long)pvVar4 + 0xc);
    if (iVar8 < iVar1) {
      iVar9 = *(int *)((long)pvVar4 + 0x10);
      iVar10 = *(int *)((long)pvVar3 + 0x10);
    }
    else {
      iVar10 = *(int *)((long)pvVar3 + 0x10);
      iVar9 = *(int *)((long)pvVar4 + 0x10);
      if (iVar10 <= iVar9) {
        iVar8 = *(int *)((long)pvVar4 + 4);
        if (0 < (long)iVar8) {
          lVar5 = *(long *)((long)pvVar4 + 0x28);
          iVar9 = *(int *)((long)pvVar4 + 0x14);
          lVar6 = *(long *)((long)pvVar3 + 0x28);
          iVar2 = *(int *)((long)pvVar3 + 0x14);
          lVar11 = 0;
          do {
            if (SBORROW4(iVar10,-iVar1) == iVar10 + iVar1 < 0) {
              lVar12 = *(long *)(lVar5 + lVar11 * 8) + (long)iVar9 * 8 + (long)iVar1 * -8;
              lVar7 = *(long *)(lVar6 + lVar11 * 8);
              lVar13 = 0;
              do {
                *(double *)(lVar12 + lVar13 * 8) =
                     *(double *)(lVar12 + lVar13 * 8) * c +
                     *(double *)(lVar7 + (long)iVar2 * 8 + (long)iVar1 * -8 + lVar13 * 8);
                lVar13 = lVar13 + 1;
              } while (iVar1 + iVar10 + 1 != (int)lVar13);
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != iVar8);
        }
        return 0;
      }
    }
    if (iVar10 < iVar9) {
      iVar10 = iVar9;
    }
    if (iVar1 < iVar8) {
      iVar1 = iVar8;
    }
    iVar8 = *(int *)((long)pvVar4 + 4);
    iVar9 = iVar8 + -1;
    if (iVar10 + iVar1 < iVar8) {
      iVar9 = iVar10 + iVar1;
    }
    A_00 = SUNBandMatrixStorage(iVar8,iVar1,iVar10,iVar9,A->sunctx);
    pvVar3 = A->content;
    iVar8 = *(int *)((long)pvVar3 + 4);
    if (0 < (long)iVar8) {
      lVar5 = *(long *)((long)pvVar3 + 0x28);
      iVar1 = *(int *)((long)pvVar3 + 0x14);
      lVar6 = *(long *)((long)A_00->content + 0x28);
      iVar9 = *(int *)((long)A_00->content + 0x14);
      iVar10 = *(int *)((long)pvVar3 + 0xc);
      iVar2 = *(int *)((long)pvVar3 + 0x10);
      lVar11 = 0;
      do {
        if (SBORROW4(iVar2,-iVar10) == iVar2 + iVar10 < 0) {
          lVar7 = *(long *)(lVar6 + lVar11 * 8);
          lVar12 = *(long *)(lVar5 + lVar11 * 8);
          lVar13 = 0;
          do {
            *(double *)(lVar7 + (long)iVar9 * 8 + (long)iVar10 * -8 + lVar13 * 8) =
                 *(double *)(lVar12 + (long)iVar1 * 8 + (long)iVar10 * -8 + lVar13 * 8) * c;
            lVar13 = lVar13 + 1;
          } while (iVar2 + iVar10 + 1 != (int)lVar13);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != iVar8);
    }
    pvVar4 = B->content;
    iVar8 = *(int *)((long)pvVar4 + 4);
    if (0 < (long)iVar8) {
      lVar5 = *(long *)((long)pvVar4 + 0x28);
      iVar1 = *(int *)((long)pvVar4 + 0x14);
      lVar6 = *(long *)((long)A_00->content + 0x28);
      iVar9 = *(int *)((long)A_00->content + 0x14);
      iVar10 = *(int *)((long)pvVar4 + 0xc);
      iVar2 = *(int *)((long)pvVar4 + 0x10);
      lVar11 = 0;
      do {
        if (SBORROW4(iVar2,-iVar10) == iVar2 + iVar10 < 0) {
          lVar12 = *(long *)(lVar6 + lVar11 * 8) + (long)iVar9 * 8 + (long)iVar10 * -8;
          lVar7 = *(long *)(lVar5 + lVar11 * 8);
          lVar13 = 0;
          do {
            *(double *)(lVar12 + lVar13 * 8) =
                 *(double *)(lVar7 + (long)iVar1 * 8 + (long)iVar10 * -8 + lVar13 * 8) +
                 *(double *)(lVar12 + lVar13 * 8);
            lVar13 = lVar13 + 1;
          } while (iVar2 + iVar10 + 1 != (int)lVar13);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != iVar8);
    }
    free(*(void **)((long)pvVar3 + 0x18));
    pvVar3 = A->content;
    iVar8 = 0;
    *(undefined8 *)((long)pvVar3 + 0x18) = 0;
    free(*(void **)((long)pvVar3 + 0x28));
    free(A->content);
    A->content = (void *)0x0;
    A->content = A_00->content;
    A_00->content = (void *)0x0;
    SUNMatDestroy_Band(A_00);
  }
  return iVar8;
}

Assistant:

int SUNMatScaleAdd_Band(realtype c, SUNMatrix A, SUNMatrix B)
{
  sunindextype i, j;
  realtype *A_colj, *B_colj;

  /* Verify that A and B are compatible */
  if (!SMCompatible_Band(A, B))
    return SUNMAT_ILL_INPUT;

  /* Call separate routine in B has larger bandwidth(s) than A */
  if ( (SM_UBAND_B(B) > SM_UBAND_B(A)) ||
       (SM_LBAND_B(B) > SM_LBAND_B(A)) ) {
    return SMScaleAddNew_Band(c,A,B);
  }

  /* Otherwise, perform operation in-place */
  for (j=0; j<SM_COLUMNS_B(A); j++) {
    A_colj = SM_COLUMN_B(A,j);
    B_colj = SM_COLUMN_B(B,j);
    for (i=-SM_UBAND_B(B); i<=SM_LBAND_B(B); i++)
      A_colj[i] = c*A_colj[i] + B_colj[i];
  }
  return SUNMAT_SUCCESS;
}